

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitGraph.c
# Opt level: O2

Kit_Edge_t
Kit_GraphAddNodeMux(Kit_Graph_t *pGraph,Kit_Edge_t eEdgeC,Kit_Edge_t eEdgeT,Kit_Edge_t eEdgeE,
                   int Type)

{
  Kit_Edge_t KVar1;
  Kit_Edge_t KVar2;
  
  if (Type != 0) {
    KVar1 = Kit_GraphAddNodeAnd(pGraph,eEdgeC,(Kit_Edge_t)((uint)eEdgeT ^ 1));
    KVar2 = Kit_GraphAddNodeAnd(pGraph,(Kit_Edge_t)((uint)eEdgeC ^ 1),(Kit_Edge_t)((uint)eEdgeE ^ 1)
                               );
    KVar1 = Kit_GraphAddNodeOr(pGraph,KVar1,KVar2);
    return (Kit_Edge_t)((uint)KVar1 ^ 1);
  }
  KVar1 = Kit_GraphAddNodeAnd(pGraph,eEdgeC,eEdgeT);
  KVar2 = Kit_GraphAddNodeAnd(pGraph,(Kit_Edge_t)((uint)eEdgeC ^ 1),eEdgeE);
  KVar1 = Kit_GraphAddNodeOr(pGraph,KVar1,KVar2);
  return KVar1;
}

Assistant:

Kit_Edge_t Kit_GraphAddNodeMux( Kit_Graph_t * pGraph, Kit_Edge_t eEdgeC, Kit_Edge_t eEdgeT, Kit_Edge_t eEdgeE, int Type )
{
    Kit_Edge_t eNode0, eNode1, eNode;
    if ( Type == 0 )
    {
        // derive the first AND
        eNode0 = Kit_GraphAddNodeAnd( pGraph, eEdgeC, eEdgeT );
        // derive the second AND
        eEdgeC.fCompl ^= 1;
        eNode1 = Kit_GraphAddNodeAnd( pGraph, eEdgeC, eEdgeE );
        // derive the final OR
        eNode = Kit_GraphAddNodeOr( pGraph, eNode0, eNode1 );
    }
    else
    {
        // complement the arguments
        eEdgeT.fCompl ^= 1;
        eEdgeE.fCompl ^= 1;
        // derive the first AND
        eNode0 = Kit_GraphAddNodeAnd( pGraph, eEdgeC, eEdgeT );
        // derive the second AND
        eEdgeC.fCompl ^= 1;
        eNode1 = Kit_GraphAddNodeAnd( pGraph, eEdgeC, eEdgeE );
        // derive the final OR
        eNode = Kit_GraphAddNodeOr( pGraph, eNode0, eNode1 );
        eNode.fCompl ^= 1;
    }
    return eNode;
}